

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O0

value_type_conflict2 __thiscall
unodb::
mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::get_node_count<(unodb::node_type)0>
          (mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
           *this)

{
  value_type_conflict2 vVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mutex);
  vVar1 = db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::get_node_count<(unodb::node_type)0>(&this->db_);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return vVar1;
}

Assistant:

[[nodiscard]] auto get_node_count() const {
    const std::lock_guard guard{mutex};
    return db_.template get_node_count<NodeType>();
  }